

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdir-posix.c
# Opt level: O3

pboolean p_dir_create(pchar *path,pint mode,PError **error)

{
  int iVar1;
  stat sb;
  stat local_b0;
  
  if (path == (pchar *)0x0) {
    p_dir_create_cold_2();
  }
  else {
    iVar1 = stat(path,&local_b0);
    if ((iVar1 == 0) && ((local_b0.st_mode & 0xf000) == 0x4000)) {
      return 1;
    }
    iVar1 = mkdir(path,mode);
    if (iVar1 == 0) {
      return 1;
    }
    p_dir_create_cold_1();
  }
  return 0;
}

Assistant:

P_LIB_API pboolean
p_dir_create (const pchar	*path,
	      pint		mode,
	      PError		**error)
{
	if (P_UNLIKELY (path == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	if (p_dir_is_exists (path))
		return TRUE;

	if (P_UNLIKELY (mkdir (path, (mode_t) mode) != 0)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_last_io (),
				     p_error_get_last_system (),
				     "Failed to call mkdir() to create directory");
		return FALSE;
	} else
		return TRUE;
}